

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VSetArrayPointer(N_Vector W,sunindextype param_2,int myid)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timespec spec;
  timespec local_40;
  
  if (W->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required operations\n",
           (ulong)(uint)myid);
LAB_00103c44:
    iVar6 = 1;
  }
  else {
    __ptr = malloc(param_2 * 8);
    auVar1 = _DAT_00111020;
    if (0 < param_2) {
      lVar4 = param_2 + -1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar3 = 0;
      auVar9 = auVar9 ^ _DAT_00111020;
      auVar10 = _DAT_00111010;
      do {
        auVar11 = auVar10 ^ auVar1;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *(undefined8 *)((long)__ptr + uVar3 * 8) = 0x3ff0000000000000;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *(undefined8 *)((long)__ptr + uVar3 * 8 + 8) = 0x3ff0000000000000;
        }
        uVar3 = uVar3 + 2;
        lVar4 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar4 + 2;
      } while ((param_2 + 1U & 0xfffffffffffffffe) != uVar3);
    }
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar8 = (double)local_40.tv_nsec;
    N_VSetArrayPointer(__ptr,W);
    clock_gettime(1,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    N_VConst(0xbfe0000000000000);
    if (0 < param_2) {
      iVar6 = 0;
      lVar7 = 0;
      do {
        iVar2 = SUNRCompare(*(undefined8 *)((long)__ptr + lVar7 * 8),0xbfe0000000000000);
        iVar6 = iVar6 + iVar2;
        lVar7 = lVar7 + 1;
      } while (param_2 != lVar7);
      if (iVar6 != 0) {
        printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n",(ulong)(uint)myid);
        puts("    Failed N_VConst check \n");
        free(__ptr);
        goto LAB_00103c44;
      }
    }
    free(__ptr);
    if (myid == 0) {
      puts("PASSED test -- N_VSetArrayPointer ");
    }
    max_time(W,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
               (dVar8 / 1000000000.0 + (double)lVar5));
    iVar6 = 0;
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VSetArrayPointer");
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Test_N_VSetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int failure = 0;
  sunindextype i;
  double start_time, stop_time, maxt;
  sunrealtype* Wdata;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* create vector data */
  Wdata = (sunrealtype*)malloc(local_length * sizeof(sunrealtype));
  for (i = 0; i < local_length; i++) { Wdata[i] = ONE; }

  /* attach data to vector */
  start_time = get_time();
  N_VSetArrayPointer(Wdata, W);
  stop_time = get_time();

  /* check vector data */
  N_VConst(NEG_HALF, W);
  for (i = 0; i < local_length; i++)
  {
    failure += SUNRCompare(Wdata[i], NEG_HALF);
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    free(Wdata);
    return (1);
  }

  free(Wdata);

  if (myid == 0) { printf("PASSED test -- N_VSetArrayPointer \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VSetArrayPointer", maxt);

  return (0);
}